

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * phosg::escape_url(string *__return_storage_ptr__,string *s,bool escape_slash)

{
  uint uVar1;
  byte __c;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      __c = pcVar3[sVar5];
      iVar4 = isalnum((int)(char)__c);
      if (iVar4 == 0) {
        uVar1 = __c - 0x26;
        if ((((uVar1 < 0x3a) && ((0x200000000800181U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
            (__c == 0x7e)) || (__c == 0x2f && !escape_slash)) goto LAB_0010789b;
        string_printf_abi_cxx11_(&local_50,"%%%02hhX",(ulong)(uint)(int)(char)__c);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_0010789b:
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string escape_url(const string& s, bool escape_slash) {
  string ret;
  for (char ch : s) {
    if (isalnum(ch) || (ch == '-') || (ch == '_') || (ch == '.') ||
        (ch == '~') || (ch == '=') || (ch == '&') || (!escape_slash && (ch == '/'))) {
      ret += ch;
    } else {
      ret += string_printf("%%%02hhX", ch);
    }
  }
  return ret;
}